

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O0

void pbrt::LogFatal<std::__cxx11::string_const&,int&>
               (LogLevel level,char *file,int line,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int *args_1)

{
  string s;
  int *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  
  StringPrintf<std::__cxx11::string_const&,int&>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::c_str();
  LogFatal(s.field_2._12_4_,(char *)s.field_2._M_allocated_capacity,s._M_string_length._4_4_,
           (char *)s._0_8_);
}

Assistant:

inline void LogFatal(LogLevel level, const char *file, int line, const char *fmt,
                     Args &&... args) {
#ifdef PBRT_IS_GPU_CODE
    LogFatal(level, file, line, fmt);  // just the format string #yolo
#else
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    LogFatal(level, file, line, s.c_str());
#endif
}